

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_allocator.h
# Opt level: O2

void density::detail::PageAllocator<density::detail::SystemPageManager<256UL>_>::unpin_page
               (void *i_address)

{
  long *plVar1;
  long lVar2;
  long *in_FS_OFFSET;
  
  PageAllocator<density::detail::SystemPageManager<256ul>>::t_instance::__tls_init();
  process_pending_unpins
            ((PageAllocator<density::detail::SystemPageManager<256UL>_> *)(*in_FS_OFFSET + -0x68),
             progress_lock_free);
  LOCK();
  plVar1 = (long *)(((ulong)i_address & 0xffffffffffffff00) + 0xf8);
  lVar2 = *plVar1;
  *plVar1 = *plVar1 + -1;
  UNLOCK();
  if (lVar2 == 0) {
    density_tests::detail::assert_failed<>
              ("prev_pins > 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/page_allocator.h"
               ,0xf9);
  }
  return;
}

Assistant:

static void unpin_page(void * const i_address) noexcept
            {
                t_instance.process_pending_unpins(progress_lock_free);

                auto const footer    = get_footer(i_address);
                auto const prev_pins = footer->m_pin_count.fetch_sub(1, detail::mem_relaxed);
                DENSITY_ASSERT(prev_pins > 0);
                (void)prev_pins;
            }